

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotHLines<float>(char *label_id,float *ys,int count,int offset,int stride)

{
  bool bVar1;
  ImPlotScale IVar2;
  TransformerLogLog local_c4;
  TransformerLinLog local_c0;
  TransformerLogLin local_bc;
  TransformerLinLin local_b8;
  ImU32 local_b4;
  ImDrawList *pIStack_b0;
  ImU32 col_line;
  ImDrawList *DrawList;
  ImPlotNextItemData *s;
  double local_98;
  int local_8c;
  undefined1 local_88 [4];
  int i;
  GetterXRefYs<float> get_max;
  GetterXRefYs<float> get_min;
  ImPlotLimits lims;
  int stride_local;
  int offset_local;
  int count_local;
  float *ys_local;
  char *label_id_local;
  
  bVar1 = BeginItem(label_id,0);
  if (bVar1) {
    GetPlotLimits((ImPlotLimits *)&get_min.Stride,-1);
    GetterXRefYs<float>::GetterXRefYs
              ((GetterXRefYs<float> *)&get_max.Stride,(double)get_min._24_8_,ys,count,offset,stride)
    ;
    GetterXRefYs<float>::GetterXRefYs
              ((GetterXRefYs<float> *)local_88,lims.X.Min,ys,count,offset,stride);
    bVar1 = FitThisFrame();
    if (bVar1) {
      for (local_8c = 0; local_8c < (int)get_min.Ys; local_8c = local_8c + 1) {
        _s = GetterXRefYs<float>::operator()((GetterXRefYs<float> *)&get_max.Stride,local_8c);
        FitPointY(local_98);
      }
    }
    DrawList = (ImDrawList *)GetItemData();
    pIStack_b0 = GetPlotDrawList();
    if (((ulong)(DrawList->_TextureIdStack).Data & 0x100000000) != 0) {
      local_b4 = ImGui::GetColorU32((ImVec4 *)DrawList);
      IVar2 = GetCurrentScale();
      switch(IVar2) {
      case 0:
        TransformerLinLin::TransformerLinLin(&local_b8);
        RenderLineSegments<ImPlot::GetterXRefYs<float>,ImPlot::GetterXRefYs<float>,ImPlot::TransformerLinLin>
                  ((GetterXRefYs<float> *)&get_max.Stride,(GetterXRefYs<float> *)local_88,&local_b8,
                   pIStack_b0,*(float *)&DrawList->_IdxWritePtr,local_b4);
        break;
      case 1:
        TransformerLogLin::TransformerLogLin(&local_bc);
        RenderLineSegments<ImPlot::GetterXRefYs<float>,ImPlot::GetterXRefYs<float>,ImPlot::TransformerLogLin>
                  ((GetterXRefYs<float> *)&get_max.Stride,(GetterXRefYs<float> *)local_88,&local_bc,
                   pIStack_b0,*(float *)&DrawList->_IdxWritePtr,local_b4);
        break;
      case 2:
        TransformerLinLog::TransformerLinLog(&local_c0);
        RenderLineSegments<ImPlot::GetterXRefYs<float>,ImPlot::GetterXRefYs<float>,ImPlot::TransformerLinLog>
                  ((GetterXRefYs<float> *)&get_max.Stride,(GetterXRefYs<float> *)local_88,&local_c0,
                   pIStack_b0,*(float *)&DrawList->_IdxWritePtr,local_b4);
        break;
      case 3:
        TransformerLogLog::TransformerLogLog(&local_c4);
        RenderLineSegments<ImPlot::GetterXRefYs<float>,ImPlot::GetterXRefYs<float>,ImPlot::TransformerLogLog>
                  ((GetterXRefYs<float> *)&get_max.Stride,(GetterXRefYs<float> *)local_88,&local_c4,
                   pIStack_b0,*(float *)&DrawList->_IdxWritePtr,local_b4);
      }
    }
    EndItem();
  }
  return;
}

Assistant:

void PlotHLines(const char* label_id, const T* ys, int count, int offset, int stride) {
    if (BeginItem(label_id, ImPlotCol_Line)) {
        const ImPlotLimits lims = GetPlotLimits();
        GetterXRefYs<T> get_min(lims.X.Min,ys,count,offset,stride);
        GetterXRefYs<T> get_max(lims.X.Max,ys,count,offset,stride);
        if (FitThisFrame()) {
            for (int i = 0; i < get_min.Count; ++i)
                FitPointY(get_min(i).y);
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        // render stems
        if (s.RenderLine) {
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderLineSegments(get_min, get_max, TransformerLinLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLin: RenderLineSegments(get_min, get_max, TransformerLogLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LinLog: RenderLineSegments(get_min, get_max, TransformerLinLog(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLog: RenderLineSegments(get_min, get_max, TransformerLogLog(), DrawList, s.LineWeight, col_line); break;
            }
        }
        EndItem();
    }
}